

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

opStatus __thiscall
llvm::detail::DoubleAPFloat::convertToInteger
          (DoubleAPFloat *this,MutableArrayRef<unsigned_long> Input,uint Width,bool IsSigned,
          roundingMode RM,bool *IsExact)

{
  MutableArrayRef<unsigned_long> Input_00;
  opStatus oVar1;
  DoubleAPFloat local_60;
  APFloat local_50;
  roundingMode local_2c;
  byte local_25;
  roundingMode RM_local;
  bool IsSigned_local;
  DoubleAPFloat *pDStack_20;
  uint Width_local;
  DoubleAPFloat *this_local;
  MutableArrayRef<unsigned_long> Input_local;
  
  Input_local.super_ArrayRef<unsigned_long>.Data =
       (unsigned_long *)Input.super_ArrayRef<unsigned_long>.Length;
  this_local = (DoubleAPFloat *)Input.super_ArrayRef<unsigned_long>.Data;
  local_2c = RM;
  local_25 = IsSigned;
  RM_local = Width;
  pDStack_20 = this;
  if (this->Semantics != (fltSemantics *)semPPCDoubleDouble) {
    __assert_fail("Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x10cf,
                  "APFloat::opStatus llvm::detail::DoubleAPFloat::convertToInteger(MutableArrayRef<integerPart>, unsigned int, bool, roundingMode, bool *) const"
                 );
  }
  bitcastToAPInt(&local_60);
  APFloat::APFloat(&local_50,(fltSemantics *)semPPCDoubleDoubleLegacy,(APInt *)&local_60);
  Input_00.super_ArrayRef<unsigned_long>.Length =
       (size_type)Input_local.super_ArrayRef<unsigned_long>.Data;
  Input_00.super_ArrayRef<unsigned_long>.Data = (unsigned_long *)this_local;
  oVar1 = APFloat::convertToInteger
                    (&local_50,Input_00,RM_local,(bool)(local_25 & 1),local_2c,IsExact);
  APFloat::~APFloat(&local_50);
  APInt::~APInt((APInt *)&local_60);
  return oVar1;
}

Assistant:

APFloat::opStatus
DoubleAPFloat::convertToInteger(MutableArrayRef<integerPart> Input,
                                unsigned int Width, bool IsSigned,
                                roundingMode RM, bool *IsExact) const {
  assert(Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  return APFloat(semPPCDoubleDoubleLegacy, bitcastToAPInt())
      .convertToInteger(Input, Width, IsSigned, RM, IsExact);
}